

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O1

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  QArrayData *pQVar2;
  XmlOutput *pXVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  xml_output local_2d0;
  xml_output local_298;
  xml_output local_260;
  xml_output local_228;
  xml_output local_1f0;
  xml_output local_1b8;
  xml_output local_180;
  xml_output local_148;
  xml_output local_110;
  xml_output local_d8;
  xml_output local_a0;
  xml_output local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar4.m_data = (storage_type *)0x3;
  QVar4.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar4);
  local_68.xo_text.d.size = (qsizetype)local_68.xo_text.d.ptr;
  pQVar2 = (QArrayData *)CONCAT44(local_68._4_4_,local_68.xo_type);
  local_68.xo_type = tTag;
  local_68.xo_text.d.ptr = (char16_t *)local_68.xo_text.d.d;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.xo_value.d.d = (Data *)0x0;
  local_68.xo_value.d.ptr = (char16_t *)0x0;
  local_68.xo_value.d.size = 0;
  local_68.xo_text.d.d = (Data *)pQVar2;
  pXVar3 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_68);
  attrTagX(&local_a0,"AdditionalDependencies",(QStringList *)((long)__buf + 8),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_a0);
  attrTagX(&local_d8,"AdditionalLibraryDirectories",(QStringList *)((long)__buf + 0x20),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_d8);
  attrTagX(&local_110,"AdditionalOptions",(QStringList *)((long)__buf + 0x38)," ");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_110);
  attrTagX(&local_148,"ExportNamedFunctions",(QStringList *)((long)__buf + 0x50),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_148);
  attrTagX(&local_180,"ForceSymbolReferences",(QStringList *)((long)__buf + 0x68),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_180);
  attrTagT(&local_1b8,"IgnoreAllDefaultLibraries",*(triState *)((long)__buf + 0x80));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_1b8);
  attrTagX(&local_1f0,"IgnoreSpecificDefaultLibraries",(QStringList *)((long)__buf + 0x88),";");
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_1f0);
  if (*(long *)((long)__buf + 0xb0) == 0) {
    local_228.xo_type = tNothing;
    local_228.xo_text.d.d = (Data *)0x0;
    local_228.xo_text.d.ptr = (char16_t *)0x0;
    local_228.xo_text.d.size = 0;
    local_228.xo_value.d.d = (Data *)0x0;
    local_228.xo_value.d.ptr = (char16_t *)0x0;
    local_228.xo_value.d.size = 0;
  }
  else {
    QVar5.m_data = (storage_type *)0x14;
    QVar5.m_size = (qsizetype)&local_228;
    QString::fromUtf8(QVar5);
    local_228.xo_text.d.size = (qsizetype)local_228.xo_text.d.ptr;
    pQVar1 = (QArrayData *)CONCAT44(local_228._4_4_,local_228.xo_type);
    local_228.xo_type = tTagValue;
    local_228.xo_text.d.ptr = (char16_t *)local_228.xo_text.d.d;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_228.xo_value.d.d = *(Data **)((long)__buf + 0xa0);
    local_228.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xa8);
    local_228.xo_value.d.size = *(qsizetype *)((long)__buf + 0xb0);
    if (&(local_228.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_228.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_228.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_228.xo_text.d.d = (Data *)pQVar1;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_228);
  if (*(long *)((long)__buf + 200) == 0) {
    local_260.xo_type = tNothing;
    local_260.xo_text.d.d = (Data *)0x0;
    local_260.xo_text.d.ptr = (char16_t *)0x0;
    local_260.xo_text.d.size = 0;
    local_260.xo_value.d.d = (Data *)0x0;
    local_260.xo_value.d.ptr = (char16_t *)0x0;
    local_260.xo_value.d.size = 0;
  }
  else {
    QVar6.m_data = (storage_type *)0xa;
    QVar6.m_size = (qsizetype)&local_260;
    QString::fromUtf8(QVar6);
    local_260.xo_text.d.size = (qsizetype)local_260.xo_text.d.ptr;
    pQVar1 = (QArrayData *)CONCAT44(local_260._4_4_,local_260.xo_type);
    local_260.xo_type = tTagValue;
    local_260.xo_text.d.ptr = (char16_t *)local_260.xo_text.d.d;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_260.xo_value.d.d = *(Data **)((long)__buf + 0xb8);
    local_260.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xc0);
    local_260.xo_value.d.size = *(qsizetype *)((long)__buf + 200);
    if (&(local_260.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_260.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_260.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_260.xo_text.d.d = (Data *)pQVar1;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_260);
  attrTagT(&local_298,"SuppressStartupBanner",*(triState *)((long)__buf + 0xd0));
  pXVar3 = XmlOutput::operator<<(pXVar3,&local_298);
  QVar7.m_data = (storage_type *)0x3;
  QVar7.m_size = (qsizetype)&local_2d0;
  QString::fromUtf8(QVar7);
  local_2d0.xo_text.d.size = (qsizetype)local_2d0.xo_text.d.ptr;
  pQVar1 = (QArrayData *)CONCAT44(local_2d0._4_4_,local_2d0.xo_type);
  local_2d0.xo_type = tCloseTag;
  local_2d0.xo_text.d.ptr = (char16_t *)local_2d0.xo_text.d.d;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2d0.xo_value.d.d = (Data *)0x0;
  local_2d0.xo_value.d.ptr = (char16_t *)0x0;
  local_2d0.xo_value.d.size = 0;
  local_2d0.xo_text.d.d = (Data *)pQVar1;
  XmlOutput::operator<<(pXVar3,&local_2d0);
  if (&(local_2d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2d0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2d0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (&(local_298.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_298.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_298.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_298.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_298.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_298.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_298.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_298.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_298.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_298.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_260.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_260.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_260.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_260.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_260.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_260.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_260.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_260.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_260.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_260.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_228.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_228.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_228.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_228.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_228.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_228.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_228.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_228.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_228.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_228.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_180.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_180.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_180.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_180.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_180.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_180.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_180.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_180.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_180.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_180.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_148.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_148.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_148.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_148.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_148.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_148.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_110.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_110.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_110.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_110.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_110.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_110.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_110.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_110.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_110.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_110.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_68.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCLibrarianTool &tool)
{
    xml
        << tag(_Lib)
            << attrTagX(_AdditionalDependencies, tool.AdditionalDependencies, ";")
            << attrTagX(_AdditionalLibraryDirectories, tool.AdditionalLibraryDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagX(_ExportNamedFunctions, tool.ExportNamedFunctions, ";")
            << attrTagX(_ForceSymbolReferences, tool.ForceSymbolReferences, ";")
            << attrTagT(_IgnoreAllDefaultLibraries, tool.IgnoreAllDefaultLibraries)
            << attrTagX(_IgnoreSpecificDefaultLibraries, tool.IgnoreDefaultLibraryNames, ";")
            << attrTagS(_ModuleDefinitionFile, tool.ModuleDefinitionFile)
            << attrTagS(_OutputFile, tool.OutputFile)
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << closetag(_Lib);
}